

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O1

int Saig_ManBmcSimple(Aig_Man_t *pAig,int nFrames,int nSizeMax,int nConfLimit,int fRewrite,
                     int fVerbose,int *piFrame,int nCofFanLit,int fUseSatoko)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Aig_Man_t *p;
  Aig_Man_t *p_00;
  Cnf_Dat_t *pCnf;
  satoko_t *s;
  sat_solver *s_00;
  Vec_Ptr_t *pVVar7;
  satoko_stats_t *psVar8;
  long *plVar9;
  Vec_Int_t *__ptr;
  int *piVar10;
  Abc_Cex_t *pAVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int Lit;
  timespec ts;
  int local_cc;
  Aig_Man_t *local_c8;
  int local_bc;
  ulong local_b8;
  void *local_b0;
  satoko_opts_t local_a8;
  long *local_40;
  long local_38;
  
  uVar14 = (ulong)(uint)nFrames;
  local_bc = nConfLimit;
  iVar3 = clock_gettime(3,(timespec *)&local_a8);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.prop_limit),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.conf_limit * -1000000;
  }
  if (nCofFanLit == 0) {
    if (nSizeMax < 1) {
      p = Saig_ManFramesBmc(pAig,nFrames);
    }
    else {
      p = Saig_ManFramesBmcLimit(pAig,nFrames,nSizeMax);
      uVar14 = (ulong)((uint)(0 < p->nObjs[3] % pAig->nTruePos) + p->nObjs[3] / pAig->nTruePos);
    }
  }
  else {
    p = Gia_ManCofactorAig(pAig,nFrames,nCofFanLit);
    if (p == (Aig_Man_t *)0x0) {
      return -1;
    }
  }
  if (piFrame != (int *)0x0) {
    *piFrame = (int)uVar14;
  }
  if (fVerbose != 0) {
    local_b0 = (void *)CONCAT44(local_b0._4_4_,fRewrite);
    local_b8 = CONCAT44(local_b8._4_4_,pAig->nRegs);
    uVar5 = pAig->nTruePis;
    uVar1 = pAig->nTruePos;
    iVar3 = pAig->nObjs[6];
    iVar6 = pAig->nObjs[5];
    uVar4 = Aig_ManLevelNum(pAig);
    printf("Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar5,
           (ulong)uVar1,local_b8 & 0xffffffff,(ulong)(uint)(iVar3 + iVar6),(ulong)uVar4);
    uVar5 = p->nObjs[2];
    local_c8 = p;
    Aig_ManLevelNum(p);
    iVar3 = 0x9f7285;
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",uVar14,(ulong)uVar5);
    Abc_Print(iVar3,"%s =","Time");
    iVar6 = 3;
    iVar3 = clock_gettime(3,(timespec *)&local_a8);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
    fflush(_stdout);
    p = local_c8;
    fRewrite = (int)local_b0;
  }
  p_00 = p;
  if (fRewrite != 0) {
    iVar3 = clock_gettime(3,(timespec *)&local_a8);
    if (iVar3 < 0) {
      lVar12 = 1;
    }
    else {
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.prop_limit),8);
      lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.conf_limit * -1000000;
    }
    p_00 = Dar_ManRwsat(p,1,0);
    Aig_ManStop(p);
    if (fVerbose != 0) {
      iVar3 = p_00->nObjs[6];
      iVar6 = p_00->nObjs[5];
      uVar5 = Aig_ManLevelNum(p_00);
      iVar15 = 0x9f72c1;
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)(uint)(iVar3 + iVar6),
             (ulong)uVar5);
      Abc_Print(iVar15,"%s =","Time");
      iVar6 = 3;
      iVar3 = clock_gettime(3,(timespec *)&local_a8);
      if (iVar3 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
      }
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
      fflush(_stdout);
    }
  }
  iVar3 = clock_gettime(3,(timespec *)&local_a8);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.prop_limit),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.conf_limit * -1000000;
  }
  pCnf = Cnf_Derive(p_00,p_00->nObjs[3]);
  lVar13 = (long)local_bc;
  local_38 = lVar13;
  if (fUseSatoko == 0) {
    s_00 = sat_solver_new();
    sat_solver_setnvars(s_00,pCnf->nVars);
    s = (satoko_t *)0x0;
    lVar13 = 0;
    while (lVar13 < pCnf->nClauses) {
      iVar3 = sat_solver_addclause(s_00,pCnf->pClauses[lVar13],pCnf->pClauses[lVar13 + 1]);
      lVar13 = lVar13 + 1;
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                      ,0x11c,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
  }
  else {
    satoko_default_opts(&local_a8);
    local_a8.conf_limit = lVar13;
    s = satoko_create();
    satoko_configure(s,&local_a8);
    satoko_setnvars(s,pCnf->nVars);
    lVar13 = 0;
    while (lVar13 < pCnf->nClauses) {
      piVar10 = pCnf->pClauses[lVar13];
      iVar3 = satoko_add_clause(s,piVar10,
                                (int)((ulong)((long)pCnf->pClauses[lVar13 + 1] - (long)piVar10) >> 2
                                     ));
      lVar13 = lVar13 + 1;
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                      ,0x114,
                      "int Saig_ManBmcSimple(Aig_Man_t *, int, int, int, int, int, int *, int, int)"
                     );
      }
    }
    s_00 = (sat_solver *)0x0;
  }
  if (fVerbose != 0) {
    iVar3 = 0x9f7345;
    printf("CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)pCnf->nVars,
           (ulong)(uint)pCnf->nClauses,(ulong)(uint)pCnf->nLiterals);
    Abc_Print(iVar3,"%s =","Time");
    iVar6 = 3;
    iVar3 = clock_gettime(3,(timespec *)&local_a8);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
    fflush(_stdout);
  }
  if ((s_00 == (sat_solver *)0x0) || (iVar3 = sat_solver_simplify(s_00), iVar3 != 0)) {
    iVar3 = clock_gettime(3,(timespec *)&local_a8);
    if (iVar3 < 0) {
      uVar14 = 0xffffffffffffffff;
    }
    else {
      uVar14 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
    }
    pVVar7 = p_00->vCos;
    iVar3 = -1;
    if (0 < pVVar7->nSize) {
      local_40 = &(s_00->stats).propagations;
      uVar16 = 0;
      local_c8 = p_00;
      local_b8 = uVar14;
      do {
        pvVar2 = pVVar7->pArray[uVar16];
        local_cc = pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2;
        uVar5 = (int)uVar16 >> 0x1f;
        if (fVerbose != 0) {
          uVar14 = (ulong)uVar5 << 0x20 | uVar16 & 0xffffffff;
          printf("Solving output %2d of frame %3d ... \r",
                 (long)uVar14 % (long)pAig->nTruePos & 0xffffffff,
                 (long)uVar14 / (long)pAig->nTruePos & 0xffffffff);
        }
        local_b0 = pvVar2;
        clock_gettime(3,(timespec *)&local_a8);
        if (s == (satoko_t *)0x0) {
          iVar3 = sat_solver_solve(s_00,&local_cc,(lit *)&local_c8,local_38,0,0,0);
        }
        else {
          iVar3 = satoko_solve_assumptions_limit(s,&local_cc,1,local_bc);
        }
        if (fVerbose != 0) {
          uVar1 = pAig->nTruePos;
          if ((int)((long)((ulong)uVar5 << 0x20 | uVar16 & 0xffffffff) % (long)(int)uVar1) ==
              uVar1 - 1) {
            printf("Solved %2d outputs of frame %3d.  ",(ulong)uVar1,
                   (long)((ulong)uVar5 << 0x20 | uVar16 & 0xffffffff) / (long)(int)uVar1 &
                   0xffffffff);
            if (s_00 == (sat_solver *)0x0) {
              iVar6 = satoko_conflictnum(s);
              lVar12 = (long)iVar6;
              psVar8 = satoko_stats(s);
              plVar9 = &psVar8->n_propagations;
            }
            else {
              lVar12 = (s_00->stats).conflicts;
              plVar9 = local_40;
            }
            iVar6 = 0x9f73c4;
            printf("Conf =%8.0f. Imp =%11.0f. ",(double)lVar12,(double)*plVar9);
            Abc_Print(iVar6,"%s =","T");
            iVar15 = 3;
            iVar6 = clock_gettime(3,(timespec *)&local_a8);
            uVar14 = 0xffffffffffffffff;
            lVar12 = -1;
            if (-1 < iVar6) {
              lVar12 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
            }
            Abc_Print(iVar15,"%9.2f sec\n",(double)(long)(lVar12 - local_b8) / 1000000.0);
            iVar6 = clock_gettime(3,(timespec *)&local_a8);
            if (-1 < iVar6) {
              uVar14 = local_a8.prop_limit / 1000 + local_a8.conf_limit * 1000000;
            }
            fflush(_stdout);
            p_00 = local_c8;
            local_b8 = uVar14;
          }
        }
        if (iVar3 != -1) {
          if (iVar3 == 1) {
            __ptr = Cnf_DataCollectPiSatNums(pCnf,p_00);
            if (s == (satoko_t *)0x0) {
              piVar10 = Sat_SolverGetModel(s_00,__ptr->pArray,__ptr->nSize);
            }
            else {
              piVar10 = Sat2_SolverGetModel(s,__ptr->pArray,__ptr->nSize);
            }
            piVar10[local_c8->nObjs[2]] = *(int *)((long)local_b0 + 0x24);
            pAVar11 = Fra_SmlCopyCounterExample(pAig,local_c8,piVar10);
            pAig->pSeqModel = pAVar11;
            if (piVar10 != (int *)0x0) {
              free(piVar10);
            }
            if (__ptr->pArray != (int *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (int *)0x0;
            }
            p_00 = local_c8;
            if (__ptr != (Vec_Int_t *)0x0) {
              free(__ptr);
            }
            if (piFrame != (int *)0x0) {
              *piFrame = (int)((long)((ulong)uVar5 << 0x20 | uVar16 & 0xffffffff) /
                              (long)pAig->nTruePos);
            }
            iVar3 = 0;
            goto LAB_0056089e;
          }
          if (piFrame != (int *)0x0) {
            *piFrame = (int)((long)((ulong)uVar5 << 0x20 | uVar16 & 0xffffffff) /
                            (long)pAig->nTruePos);
          }
          break;
        }
        uVar16 = uVar16 + 1;
        pVVar7 = p_00->vCos;
      } while ((long)uVar16 < (long)pVVar7->nSize);
      iVar3 = -1;
    }
  }
  else {
    iVar3 = -1;
    if (fVerbose != 0) {
      puts("The BMC problem is trivially UNSAT");
      fflush(_stdout);
    }
  }
LAB_0056089e:
  if (s_00 != (sat_solver *)0x0) {
    sat_solver_delete(s_00);
  }
  if (s != (satoko_t *)0x0) {
    satoko_destroy(s);
  }
  Cnf_DataFree(pCnf);
  Aig_ManStop(p_00);
  return iVar3;
}

Assistant:

int Saig_ManBmcSimple( Aig_Man_t * pAig, int nFrames, int nSizeMax, int nConfLimit, int fRewrite, int fVerbose, int * piFrame, int nCofFanLit, int fUseSatoko )
{
    extern Aig_Man_t * Gia_ManCofactorAig( Aig_Man_t * p, int nFrames, int nCofFanLit );
    sat_solver * pSat = NULL;
    satoko_t * pSat2 = NULL;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pFrames, * pAigTemp;
    Aig_Obj_t * pObj;
    int status, Lit, i, RetValue = -1;
    abctime clk;

    // derive the timeframes
    clk = Abc_Clock();
    if ( nCofFanLit )
    {
        pFrames = Gia_ManCofactorAig( pAig, nFrames, nCofFanLit );
        if ( pFrames == NULL )
            return -1;
    }
    else if ( nSizeMax > 0 )
    {
        pFrames = Saig_ManFramesBmcLimit( pAig, nFrames, nSizeMax );
        nFrames = Aig_ManCoNum(pFrames) / Saig_ManPoNum(pAig) + ((Aig_ManCoNum(pFrames) % Saig_ManPoNum(pAig)) > 0);
    }
    else
        pFrames = Saig_ManFramesBmc( pAig, nFrames );
    if ( piFrame )
        *piFrame = nFrames;
    if ( fVerbose )
    {
        printf( "Running \"bmc\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pFrames), Aig_ManCoNum(pFrames), 
            Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    // rewrite the timeframes
    if ( fRewrite )
    {
        clk = Abc_Clock();
//        pFrames = Dar_ManBalance( pAigTemp = pFrames, 0 );
        pFrames = Dar_ManRwsat( pAigTemp = pFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pFrames), Aig_ManLevelNum(pFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
            fflush( stdout );
        }
    }
    // create the SAT solver
    clk = Abc_Clock();
    pCnf = Cnf_Derive( pFrames, Aig_ManCoNum(pFrames) );  
//if ( s_fInterrupt )
//return -1;
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfLimit;
        pSat2 = satoko_create();  
        satoko_configure(pSat2, &opts);
        satoko_setnvars(pSat2, pCnf->nVars);
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !satoko_add_clause( pSat2, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
                assert( 0 );
    }
    else
    {
        pSat = sat_solver_new();
        sat_solver_setnvars( pSat, pCnf->nVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
    if ( fVerbose )
    {
        printf( "CNF: Variables = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        ABC_PRT( "Time", Abc_Clock() - clk );
        fflush( stdout );
    }
    status = pSat ? sat_solver_simplify(pSat) : 1;
    if ( status == 0 )
    {
        if ( fVerbose )
        {
            printf( "The BMC problem is trivially UNSAT\n" );
            fflush( stdout );
        }
    }
    else
    {
        abctime clkPart = Abc_Clock();
        Aig_ManForEachCo( pFrames, pObj, i )
        {
            Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
            if ( fVerbose )
            {
                printf( "Solving output %2d of frame %3d ... \r", 
                    i % Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
            }
            clk = Abc_Clock();
            if ( pSat2 )
                status = satoko_solve_assumptions_limit( pSat2, &Lit, 1, nConfLimit );
            else
                status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( fVerbose && (i % Saig_ManPoNum(pAig) == Saig_ManPoNum(pAig) - 1) )
            {
                printf( "Solved %2d outputs of frame %3d.  ", 
                    Saig_ManPoNum(pAig), i / Saig_ManPoNum(pAig) );
                printf( "Conf =%8.0f. Imp =%11.0f. ", 
                    (double)(pSat ? pSat->stats.conflicts    : satoko_conflictnum(pSat2)), 
                    (double)(pSat ? pSat->stats.propagations : satoko_stats(pSat2)->n_propagations) );
                ABC_PRT( "T", Abc_Clock() - clkPart );
                clkPart = Abc_Clock();
                fflush( stdout );
            }
            if ( status == l_False )
            {
/*
                Lit = lit_neg( Lit );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
                assert( RetValue );
                if ( pSat->qtail != pSat->qhead )
                {
                    RetValue = sat_solver_simplify(pSat);
                    assert( RetValue );
                }
*/
            }
            else if ( status == l_True )
            {
                Vec_Int_t * vCiIds = Cnf_DataCollectPiSatNums( pCnf, pFrames );
                int * pModel = pSat2 ? Sat2_SolverGetModel(pSat2, vCiIds->pArray, vCiIds->nSize) : Sat_SolverGetModel(pSat, vCiIds->pArray, vCiIds->nSize);
                pModel[Aig_ManCiNum(pFrames)] = pObj->Id;
                pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pFrames, pModel );
                ABC_FREE( pModel );
                Vec_IntFree( vCiIds );

                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = 0;
                break;
            }
            else
            {
                if ( piFrame )
                    *piFrame = i / Saig_ManPoNum(pAig);
                RetValue = -1;
                break;
            }
        }
    }
    if ( pSat )  sat_solver_delete( pSat );
    if ( pSat2 ) satoko_destroy( pSat2 );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    return RetValue;
}